

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void act_new(char *format,CHAR_DATA *ch,void *arg1,void *arg2,int type,int min_pos)

{
  char cVar1;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar2;
  char *pcVar3;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  char *point;
  char *i;
  char *str;
  OBJ_DATA *obj2;
  OBJ_DATA *obj1;
  CHAR_DATA *vch;
  CHAR_DATA *to;
  char fname [4608];
  char buf2 [100];
  char buf [4608];
  undefined4 in_stack_ffffffffffffda98;
  int in_stack_ffffffffffffda9c;
  int in_stack_ffffffffffffdaa0;
  int in_stack_ffffffffffffdaa4;
  char *in_stack_ffffffffffffdaa8;
  CHAR_DATA *in_stack_ffffffffffffdab0;
  int in_stack_ffffffffffffdab8;
  int in_stack_ffffffffffffdabc;
  int in_stack_ffffffffffffdac0;
  int in_stack_ffffffffffffdac4;
  int in_stack_ffffffffffffdac8;
  int in_stack_ffffffffffffdacc;
  int in_stack_ffffffffffffdad0;
  int in_stack_ffffffffffffdad4;
  int in_stack_ffffffffffffdad8;
  int in_stack_ffffffffffffdadc;
  int in_stack_ffffffffffffdae0;
  int in_stack_ffffffffffffdae4;
  CHAR_DATA *in_stack_ffffffffffffdae8;
  CHAR_DATA *local_2510;
  undefined1 **local_24d0;
  CHAR_DATA *local_24c8;
  char *local_24c0;
  CHAR_DATA *local_24a0;
  CHAR_DATA local_2498 [5];
  CHAR_DATA local_1298 [5];
  int local_28;
  int local_24;
  CHAR_DATA *local_20;
  CHAR_DATA *local_18;
  CHAR_DATA *local_10;
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    return;
  }
  if (*in_RDI == '\0') {
    return;
  }
  if (in_RSI == (CHAR_DATA *)0x0) {
    return;
  }
  if (in_RSI->in_room != (ROOM_INDEX_DATA *)0x0) {
    local_24a0 = in_RSI->in_room->people;
    local_28 = in_R9D;
    local_24 = in_R8D;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (in_R8D == 2) {
      if (in_RCX == (CHAR_DATA *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffdab0,
                   in_stack_ffffffffffffdaa8);
        fmt._M_len._4_4_ = in_stack_ffffffffffffdae4;
        fmt._M_len._0_4_ = in_stack_ffffffffffffdae0;
        fmt._M_str = (char *)in_stack_ffffffffffffdae8;
        CLogger::Warn<char_const*&>
                  ((CLogger *)CONCAT44(in_stack_ffffffffffffdadc,in_stack_ffffffffffffdad8),fmt,
                   (char **)CONCAT44(in_stack_ffffffffffffdad4,in_stack_ffffffffffffdad0));
        return;
      }
      if (in_RCX->in_room == (ROOM_INDEX_DATA *)0x0) {
        return;
      }
      local_24a0 = in_RCX->in_room->people;
    }
    for (; local_24a0 != (CHAR_DATA *)0x0; local_24a0 = local_24a0->next_in_room) {
      bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98));
      if (((((((bVar2) || (local_24a0->desc != (DESCRIPTOR_DATA *)0x0)) &&
             (local_28 <= local_24a0->position)) && ((local_24 != 3 || (local_24a0 == local_10))))
           && ((local_24 != 2 || ((local_24a0 == in_RCX && (local_24a0 != local_10)))))) &&
          (((local_24 != 0 || (local_24a0 != local_10)) &&
           ((local_24 != 1 || ((local_24a0 != local_10 && (local_24a0 != in_RCX)))))))) &&
         (((local_24 != 5 ||
           (((bVar2 = is_immortal((CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98)),
             bVar2 && (local_24a0 != local_10)) &&
            (bVar2 = can_see((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffdabc,in_stack_ffffffffffffdab8),
                             in_stack_ffffffffffffdab0), bVar2)))) &&
          ((((local_24 != 6 || (bVar2 = is_same_group(local_24a0,local_10), bVar2)) &&
            ((local_24 != 7 || (bVar2 = is_same_group(local_24a0,local_10), !bVar2)))) &&
           (((local_24 != 6 && (local_24 != 7)) || (local_24a0 != local_10)))))))) {
        local_24c0 = local_8;
        local_24d0 = &local_1298[0].game_fun;
        while (*local_24c0 != '\0') {
          if (*local_24c0 == '$') {
            pcVar3 = local_24c0 + 1;
            if ((((local_20 == (CHAR_DATA *)0x0) && ('@' < *pcVar3)) && (*pcVar3 < '[')) &&
               (*pcVar3 != 'I')) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaa8);
              fmt_00._M_len._4_4_ = in_stack_ffffffffffffdae4;
              fmt_00._M_len._0_4_ = in_stack_ffffffffffffdae0;
              fmt_00._M_str = (char *)in_stack_ffffffffffffdae8;
              CLogger::Warn<char_const&>
                        ((CLogger *)CONCAT44(in_stack_ffffffffffffdadc,in_stack_ffffffffffffdad8),
                         fmt_00,(char *)CONCAT44(in_stack_ffffffffffffdad4,in_stack_ffffffffffffdad0
                                                ));
              local_24c8 = (CHAR_DATA *)0x7d1a45;
            }
            else {
              bVar2 = SUB41((uint)in_stack_ffffffffffffda9c >> 0x18,0);
              switch(*pcVar3) {
              case 'E':
                if (in_RCX->sex < 0) {
                  in_stack_ffffffffffffdadc = 0;
                }
                else if (in_RCX->sex < 3) {
                  in_stack_ffffffffffffdad8 = (int)in_RCX->sex;
                  in_stack_ffffffffffffdadc = in_stack_ffffffffffffdad8;
                }
                else {
                  in_stack_ffffffffffffdad8 = 2;
                  in_stack_ffffffffffffdadc = in_stack_ffffffffffffdad8;
                }
                local_24c8 = (CHAR_DATA *)act_new::he_she[in_stack_ffffffffffffdadc];
                break;
              case 'F':
                if (in_RCX->true_name == (char *)0x0) {
                  in_stack_ffffffffffffdae8 = (CHAR_DATA *)in_RCX->name;
                  local_24c8 = in_stack_ffffffffffffdae8;
                }
                else {
                  in_stack_ffffffffffffdae8 = (CHAR_DATA *)in_RCX->true_name;
                  local_24c8 = in_stack_ffffffffffffdae8;
                }
                break;
              default:
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaa8);
                fmt_01._M_len._4_4_ = in_stack_ffffffffffffdae4;
                fmt_01._M_len._0_4_ = in_stack_ffffffffffffdae0;
                fmt_01._M_str = (char *)in_stack_ffffffffffffdae8;
                CLogger::Warn<char_const&>
                          ((CLogger *)CONCAT44(in_stack_ffffffffffffdadc,in_stack_ffffffffffffdad8),
                           fmt_01,(char *)CONCAT44(in_stack_ffffffffffffdad4,
                                                   in_stack_ffffffffffffdad0));
                local_24c8 = (CHAR_DATA *)0x7d1a45;
                break;
              case 'I':
                sprintf((char *)local_1298,"%d",(ulong)*(uint *)&local_20->next);
                local_24c8 = local_1298;
                break;
              case 'M':
                if (in_RCX->sex < 0) {
                  in_stack_ffffffffffffdacc = 0;
                }
                else if (in_RCX->sex < 3) {
                  in_stack_ffffffffffffdac8 = (int)in_RCX->sex;
                  in_stack_ffffffffffffdacc = in_stack_ffffffffffffdac8;
                }
                else {
                  in_stack_ffffffffffffdac8 = 2;
                  in_stack_ffffffffffffdacc = in_stack_ffffffffffffdac8;
                }
                local_24c8 = (CHAR_DATA *)act_new::him_her[in_stack_ffffffffffffdacc];
                break;
              case 'N':
                local_24c8 = (CHAR_DATA *)
                             get_descr_form((CHAR_DATA *)in_stack_ffffffffffffdaa8,
                                            (CHAR_DATA *)
                                            CONCAT44(in_stack_ffffffffffffdaa4,
                                                     in_stack_ffffffffffffdaa0),bVar2);
                break;
              case 'P':
                bVar2 = can_see_obj((CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdadc,in_stack_ffffffffffffdad8),
                                    (OBJ_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdad4,in_stack_ffffffffffffdad0));
                if (bVar2) {
                  in_stack_ffffffffffffdaa8 = (char *)in_RCX->affected;
                  local_24c8 = (CHAR_DATA *)in_stack_ffffffffffffdaa8;
                }
                else {
                  in_stack_ffffffffffffdaa8 = "something";
                  local_24c8 = (CHAR_DATA *)in_stack_ffffffffffffdaa8;
                }
                break;
              case 'S':
                if (in_RCX->sex < 0) {
                  in_stack_ffffffffffffdabc = 0;
                }
                else if (in_RCX->sex < 3) {
                  in_stack_ffffffffffffdab8 = (int)in_RCX->sex;
                  in_stack_ffffffffffffdabc = in_stack_ffffffffffffdab8;
                }
                else {
                  in_stack_ffffffffffffdab8 = 2;
                  in_stack_ffffffffffffdabc = in_stack_ffffffffffffdab8;
                }
                local_24c8 = (CHAR_DATA *)act_new::his_her[in_stack_ffffffffffffdabc];
                break;
              case 'T':
                local_24c8 = local_20;
                break;
              case 'd':
                if ((local_20 == (CHAR_DATA *)0x0) || (*(char *)&local_20->next == '\0')) {
                  local_24c8 = (CHAR_DATA *)0x7d60f6;
                }
                else {
                  one_argument((char *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0)
                               ,(char *)CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98
                                                ));
                  local_24c8 = local_2498;
                }
                break;
              case 'e':
                if (local_10->sex < 0) {
                  in_stack_ffffffffffffdae4 = 0;
                }
                else if (local_10->sex < 3) {
                  in_stack_ffffffffffffdae0 = (int)local_10->sex;
                  in_stack_ffffffffffffdae4 = in_stack_ffffffffffffdae0;
                }
                else {
                  in_stack_ffffffffffffdae0 = 2;
                  in_stack_ffffffffffffdae4 = in_stack_ffffffffffffdae0;
                }
                local_24c8 = (CHAR_DATA *)act_new::he_she[in_stack_ffffffffffffdae4];
                break;
              case 'f':
                if (local_10->true_name == (char *)0x0) {
                  local_2510 = (CHAR_DATA *)local_10->name;
                }
                else {
                  local_2510 = (CHAR_DATA *)local_10->true_name;
                }
                local_24c8 = local_2510;
                break;
              case 'i':
                sprintf((char *)local_1298,"%d",(ulong)*(uint *)&local_18->next);
                local_24c8 = local_1298;
                break;
              case 'm':
                if (local_10->sex < 0) {
                  in_stack_ffffffffffffdad4 = 0;
                }
                else if (local_10->sex < 3) {
                  in_stack_ffffffffffffdad0 = (int)local_10->sex;
                  in_stack_ffffffffffffdad4 = in_stack_ffffffffffffdad0;
                }
                else {
                  in_stack_ffffffffffffdad0 = 2;
                  in_stack_ffffffffffffdad4 = in_stack_ffffffffffffdad0;
                }
                local_24c8 = (CHAR_DATA *)act_new::him_her[in_stack_ffffffffffffdad4];
                break;
              case 'n':
                local_24c8 = (CHAR_DATA *)
                             get_descr_form((CHAR_DATA *)in_stack_ffffffffffffdaa8,
                                            (CHAR_DATA *)
                                            CONCAT44(in_stack_ffffffffffffdaa4,
                                                     in_stack_ffffffffffffdaa0),bVar2);
                break;
              case 'p':
                if (in_RDX == (CHAR_DATA *)0x0) {
                  local_24c8 = (CHAR_DATA *)0x7d1a8e;
                }
                else {
                  bVar2 = can_see_obj((CHAR_DATA *)
                                      CONCAT44(in_stack_ffffffffffffdadc,in_stack_ffffffffffffdad8),
                                      (OBJ_DATA *)
                                      CONCAT44(in_stack_ffffffffffffdad4,in_stack_ffffffffffffdad0))
                  ;
                  if (bVar2) {
                    local_24c8 = (CHAR_DATA *)in_RDX->affected;
                  }
                  else {
                    local_24c8 = (CHAR_DATA *)0x7d1a8e;
                  }
                  in_stack_ffffffffffffdab0 = local_24c8;
                  if ((((3 < (long)pcVar3 - (long)local_8) && (local_24c0[-3] == '\'')) &&
                      (local_24c0[-2] == 's')) ||
                     (((5 < (long)pcVar3 - (long)local_8 && (local_24c0[-4] == 'o')) &&
                      ((local_24c0[-3] == 'u' && (local_24c0[-2] == 'r')))))) {
                    bVar2 = str_prefix((char *)CONCAT44(in_stack_ffffffffffffdacc,
                                                        in_stack_ffffffffffffdac8),
                                       (char *)CONCAT44(in_stack_ffffffffffffdac4,
                                                        in_stack_ffffffffffffdac0));
                    if (!bVar2) {
                      local_24c8 = (CHAR_DATA *)((long)&local_24c8->next + 4);
                    }
                    bVar2 = str_prefix((char *)CONCAT44(in_stack_ffffffffffffdacc,
                                                        in_stack_ffffffffffffdac8),
                                       (char *)CONCAT44(in_stack_ffffffffffffdac4,
                                                        in_stack_ffffffffffffdac0));
                    if (!bVar2) {
                      local_24c8 = (CHAR_DATA *)((long)&local_24c8->next + 2);
                    }
                  }
                }
                break;
              case 's':
                if (local_10->sex < 0) {
                  in_stack_ffffffffffffdac4 = 0;
                }
                else if (local_10->sex < 3) {
                  in_stack_ffffffffffffdac0 = (int)local_10->sex;
                  in_stack_ffffffffffffdac4 = in_stack_ffffffffffffdac0;
                }
                else {
                  in_stack_ffffffffffffdac0 = 2;
                  in_stack_ffffffffffffdac4 = in_stack_ffffffffffffdac0;
                }
                local_24c8 = (CHAR_DATA *)act_new::his_her[in_stack_ffffffffffffdac4];
                break;
              case 't':
                local_24c8 = local_18;
              }
            }
            local_24c0 = local_24c0 + 2;
            for (; cVar1 = *(char *)&local_24c8->next, *(char *)local_24d0 = cVar1, cVar1 != '\0';
                local_24c8 = (CHAR_DATA *)((long)&local_24c8->next + 1)) {
              local_24d0 = (undefined1 **)((long)local_24d0 + 1);
            }
          }
          else {
            *(char *)local_24d0 = *local_24c0;
            local_24d0 = (undefined1 **)((long)local_24d0 + 1);
            local_24c0 = local_24c0 + 1;
          }
        }
        *(char *)local_24d0 = '\n';
        *(char *)((long)local_24d0 + 1) = '\r';
        *(char *)((long)local_24d0 + 2) = '\0';
        bVar2 = str_prefix((char *)CONCAT44(in_stack_ffffffffffffdacc,in_stack_ffffffffffffdac8),
                           (char *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0));
        if (bVar2) {
          bVar2 = str_prefix((char *)CONCAT44(in_stack_ffffffffffffdacc,in_stack_ffffffffffffdac8),
                             (char *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0));
          if (bVar2) {
            if (((char)local_1298[0].game_fun < 'a') || ('z' < (char)local_1298[0].game_fun)) {
              in_stack_ffffffffffffda9c = (int)(char)local_1298[0].game_fun;
            }
            else {
              in_stack_ffffffffffffda9c = (char)local_1298[0].game_fun + -0x20;
            }
            local_1298[0].game_fun._0_1_ = (char)in_stack_ffffffffffffda9c;
          }
          else {
            if ((local_1298[0].game_fun._7_1_ < 'a') || ('z' < local_1298[0].game_fun._7_1_)) {
              in_stack_ffffffffffffdaa0 = (int)local_1298[0].game_fun._7_1_;
            }
            else {
              in_stack_ffffffffffffdaa0 = local_1298[0].game_fun._7_1_ + -0x20;
            }
            local_1298[0].game_fun._7_1_ = (char)in_stack_ffffffffffffdaa0;
          }
        }
        else {
          if ((local_1298[0].game_fun._4_1_ < 'a') || ('z' < local_1298[0].game_fun._4_1_)) {
            in_stack_ffffffffffffdaa4 = (int)local_1298[0].game_fun._4_1_;
          }
          else {
            in_stack_ffffffffffffdaa4 = local_1298[0].game_fun._4_1_ + -0x20;
          }
          local_1298[0].game_fun._4_1_ = (char)in_stack_ffffffffffffdaa4;
        }
        if (local_24a0->desc != (DESCRIPTOR_DATA *)0x0) {
          write_to_buffer((DESCRIPTOR_DATA *)
                          CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0),
                          (char *)CONCAT44(in_stack_ffffffffffffdabc,in_stack_ffffffffffffdab8),
                          (int)((ulong)in_stack_ffffffffffffdab0 >> 0x20));
        }
      }
    }
    return;
  }
  return;
}

Assistant:

void act_new(const char *format, CHAR_DATA *ch, const void *arg1, const void *arg2, int type, int min_pos)
{
	static char *const he_she[] = {"it", "he", "she"};
	static char *const him_her[] = {"it", "him", "her"};
	static char *const his_her[] = {"its", "his", "her"};

	char buf[MAX_STRING_LENGTH], buf2[100];
	char fname[MAX_INPUT_LENGTH];
	CHAR_DATA *to;
	CHAR_DATA *vch = (CHAR_DATA *)arg2;
	OBJ_DATA *obj1 = (OBJ_DATA *)arg1;
	OBJ_DATA *obj2 = (OBJ_DATA *)arg2;
	const char *str;
	const char *i;
	char *point;

	/*
	 * Discard null and zero-length messages.
	 */
	if (format == nullptr || format[0] == '\0')
		return;

	/* discard null rooms and chars */
	if (ch == nullptr || ch->in_room == nullptr)
		return;

	/*colorconv(format, format, ch);*/
	to = ch->in_room->people;

	if (type == TO_VICT)
	{
		if (vch == nullptr)
		{
			RS.Logger.Warn("Act: null vch with TO_VICT. -- {}", format);
			return;
		}

		if (vch->in_room == nullptr)
			return;

		to = vch->in_room->people;
	}

	for (; to != nullptr; to = to->next_in_room)
	{
		if ((!is_npc(to) && to->desc == nullptr) || to->position < min_pos)
			continue;

		if ((type == TO_CHAR) && to != ch)
			continue;

		if (type == TO_VICT && (to != vch || to == ch))
			continue;

		if (type == TO_ROOM && to == ch)
			continue;

		if (type == TO_NOTVICT && (to == ch || to == vch))
			continue;

		if (type == TO_IMMINROOM && (!(is_immortal(to)) || (to == ch) || !(can_see(to, ch))))
			continue;

		if (type == TO_GROUP && !is_same_group(to, ch))
			continue;

		if (type == TO_NOTGROUP && is_same_group(to, ch))
			continue;

		if ((type == TO_GROUP || type == TO_NOTGROUP) && to == ch)
			continue;

		point = buf;
		str = format;

		while (*str != '\0')
		{
			if (*str != '$')
			{
				*point++ = *str++;
				continue;
			}

			++str;

			if (arg2 == nullptr && *str >= 'A' && *str <= 'Z' && *str != 'I')
			{
				RS.Logger.Warn("Act: missing arg2 for code {}.", *str);
				i = " <@@@> ";
			}
			else
			{
				switch (*str)
				{
					/* Thx alex for 't' idea */
					case 't':
						i = (char *)arg1;
						break;
					case 'T':
						i = (char *)arg2;
						break;
					case 'n':
						i = get_descr_form(ch, to, false);
						break;
					case 'N':
						i = get_descr_form(vch, to, false);
						break;
					case 'f':
						i = (ch->true_name ? ch->true_name : ch->name);
						break;
					case 'F':
						i = (vch->true_name ? vch->true_name : vch->name);
						break;
					case 'i':
						sprintf(buf2, "%d", *((int *)arg1));
						i = (const char *)&buf2;
						break;
					case 'I':
						sprintf(buf2, "%d", *((int *)arg2));
						i = (const char *)&buf2;
						break;
					case 'e':
						i = he_she[URANGE(0, ch->sex, 2)];
						break;
					case 'E':
						i = he_she[URANGE(0, vch->sex, 2)];
						break;
					case 'm':
						i = him_her[URANGE(0, ch->sex, 2)];
						break;
					case 'M':
						i = him_her[URANGE(0, vch->sex, 2)];
						break;
					case 's':
						i = his_her[URANGE(0, ch->sex, 2)];
						break;
					case 'S':
						i = his_her[URANGE(0, vch->sex, 2)];
						break;
					case 'p':
						if (obj1 == nullptr)
						{
							i = "something";
							break;
						}

						i = can_see_obj(to, obj1) ? obj1->short_descr : "something";

						// obj article truncation: back up 2-don't truncate the/a from obj short descr unless it's preceded
						// by Your or 's
						if (((str - format) >= 4 && *(str - 4) == '\'' && *(str - 3) == 's')
							|| ((str - format) >= 6 && *(str - 5) == 'o' && *(str - 4) == 'u' && *(str - 3) == 'r'))
						{
							if (!str_prefix("the ", i))
								i += 4;

							if (!str_prefix("a ", i))
								i += 2;
						}

						break;
					case 'P':
						i = can_see_obj(to, obj2) ? obj2->short_descr : "something";
						break;
					case 'd':
						if (arg2 == nullptr || ((char *)arg2)[0] == '\0')
						{
							i = "door";
						}
						else
						{
							one_argument((char *)arg2, fname);
							i = fname;
						}
						break;
					default:
						RS.Logger.Warn("Act: bad code {}.", *str);
						i = " <@@@> ";
						break;
				}
			}

			++str;

			while ((*point = *i) != '\0')
			{
				++point, ++i;
			}
		}

		*point++ = '\n';
		*point++ = '\r';
		*point = '\0';

		if (!str_prefix("\x01B[0m", buf))
			buf[4] = UPPER(buf[4]);
		else if (!str_prefix("\x01B", buf))
			buf[7] = UPPER(buf[7]);
		else
			buf[0] = UPPER(buf[0]);

		if (to->desc != nullptr)
			write_to_buffer(to->desc, buf, point - buf);
	}
}